

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest-main.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_FlagFileTest_FailReadFlagsFromString::Run(void)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  allocator local_31;
  FlagSaver fs;
  string flags;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","FlagFileTest","FailReadFlagsFromString");
  fLI::FLAGS_test_int32 = 0x77;
  std::__cxx11::string::string
            ((string *)&flags,
             "# let\'s make sure it can update values\n-test_string=non_initial\n-test_bool=false\n-test_int32=123\n-test_double=illegal\n"
             ,&local_31);
  pcVar2 = GetArgv0();
  bVar1 = ReadFlagsFromString(&flags,pcVar2,false);
  if (bVar1) {
    fprintf(_stderr,"Check failed: %s\n","!(ReadFlagsFromString(flags, GetArgv0(), false))");
  }
  else {
    if (fLI::FLAGS_test_int32 == 0x77) {
      bVar1 = std::operator==("initial",fLS::FLAGS_test_string_abi_cxx11_);
      if (bVar1) {
        std::__cxx11::string::~string((string *)&flags);
        FlagSaver::~FlagSaver(&fs);
        return;
      }
      pcVar2 = "\"initial\"";
      pcVar3 = "FLAGS_test_string";
    }
    else {
      pcVar2 = "119";
      pcVar3 = "FLAGS_test_int32";
    }
    fprintf(_stderr,"Check failed: %s %s %s\n",pcVar2,"==",pcVar3);
  }
  exit(1);
}

Assistant:

TEST(FlagFileTest, FailReadFlagsFromString) {
  FLAGS_test_int32 = 119;
  string flags("# let's make sure it can update values\n"
               "-test_string=non_initial\n"
               "-test_bool=false\n"
               "-test_int32=123\n"
               "-test_double=illegal\n");

  EXPECT_FALSE(ReadFlagsFromString(flags,
                                   GetArgv0(),
                                   // errors are fatal
                                   false));

  EXPECT_EQ(119, FLAGS_test_int32);
  EXPECT_EQ("initial", FLAGS_test_string);
}